

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O3

int gdImageSelectiveBlur(gdImagePtr src)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int color;
  gdImagePtr dst;
  code *pcVar5;
  float (*pafVar6) [3];
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  float (*pafVar10) [3];
  uint uVar11;
  float (*pafVar12) [3];
  int iVar13;
  long lVar14;
  ulong uVar15;
  int g;
  long lVar16;
  int b;
  ulong uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  uint local_118;
  float (*local_108) [3];
  float flt_b [3] [3];
  float flt_g [3] [3];
  float flt_r [3] [3];
  
  iVar9 = 0;
  if ((src != (gdImagePtr)0x0) &&
     (dst = gdImageCreateTrueColor(src->sx,src->sy), iVar9 = 0, dst != (gdImagePtr)0x0)) {
    gdImageCopy(dst,src,0,0,0,0,src->sx,src->sy);
    if (src->trueColor == 0) {
      pcVar5 = gdImageGetPixel;
    }
    else {
      pcVar5 = gdImageGetTrueColorPixel;
    }
    iVar9 = src->sy;
    if (0 < iVar9) {
      uVar8 = (ulong)(uint)src->sx;
      uVar15 = 0;
      local_118 = 0;
      do {
        if (0 < (int)uVar8) {
          iVar2 = (int)uVar15 + -1;
          iVar9 = -1;
          uVar17 = 0;
          do {
            uVar3 = (*pcVar5)(src,uVar17 & 0xffffffff,uVar15 & 0xffffffff);
            fVar22 = 0.0;
            local_108 = flt_b;
            pafVar6 = flt_r;
            pafVar10 = flt_g;
            lVar16 = 0;
            fVar23 = 0.0;
            fVar24 = 0.0;
            do {
              lVar14 = 0;
              do {
                if (lVar14 == 1 && lVar16 == 1) {
                  flt_b[1][1] = 0.5;
                  flt_g[1][1] = 0.5;
                  flt_r[1][1] = 0.5;
                  fVar18 = 0.5;
                  fVar20 = 0.5;
                  fVar19 = 0.5;
                }
                else {
                  uVar7 = (*pcVar5)(src,iVar9 + (int)lVar14,iVar2 + (int)lVar16);
                  iVar13 = dst->trueColor;
                  uVar4 = (uint)uVar7;
                  if (iVar13 == 0) {
                    local_118 = dst->alpha[(int)uVar4];
                    uVar1 = dst->red[(int)uVar3];
                    uVar11 = dst->red[(int)uVar4];
                  }
                  else {
                    local_118 = (uint)((ulong)uVar7 >> 0x18) & 0x7f;
                    uVar11 = (uint)((ulong)uVar7 >> 0x10) & 0xff;
                    uVar1 = uVar3 >> 0x10 & 0xff;
                  }
                  fVar19 = (float)(int)uVar1 - (float)(int)uVar11;
                  fVar18 = 1.0;
                  if ((fVar19 != 0.0) || (NAN(fVar19))) {
                    fVar18 = -fVar19;
                    if (-fVar19 <= fVar19) {
                      fVar18 = fVar19;
                    }
                    fVar18 = 1.0 / fVar18;
                  }
                  (*pafVar6)[lVar14] = fVar18;
                  if (iVar13 == 0) {
                    uVar1 = dst->green[(int)uVar3];
                    uVar11 = dst->green[(int)uVar4];
                  }
                  else {
                    uVar11 = (uint)(byte)((ulong)uVar7 >> 8);
                    uVar1 = uVar3 >> 8 & 0xff;
                  }
                  fVar21 = (float)(int)uVar1 - (float)(int)uVar11;
                  fVar19 = 1.0;
                  if ((fVar21 != 0.0) || (NAN(fVar21))) {
                    fVar19 = -fVar21;
                    if (-fVar21 <= fVar21) {
                      fVar19 = fVar21;
                    }
                    fVar19 = 1.0 / fVar19;
                  }
                  (*pafVar10)[lVar14] = fVar19;
                  if (iVar13 == 0) {
                    uVar1 = dst->blue[(int)uVar3];
                    uVar4 = dst->blue[(int)uVar4];
                  }
                  else {
                    uVar4 = uVar4 & 0xff;
                    uVar1 = uVar3 & 0xff;
                  }
                  fVar21 = (float)(int)uVar1 - (float)(int)uVar4;
                  if ((fVar21 != 0.0) || (NAN(fVar21))) {
                    fVar20 = -fVar21;
                    if (-fVar21 <= fVar21) {
                      fVar20 = fVar21;
                    }
                    fVar20 = 1.0 / fVar20;
                    (*local_108)[lVar14] = fVar20;
                  }
                  else {
                    (*local_108)[lVar14] = 1.0;
                    fVar20 = 1.0;
                  }
                }
                fVar22 = fVar22 + fVar20;
                fVar23 = fVar23 + fVar19;
                fVar24 = fVar24 + fVar18;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              lVar16 = lVar16 + 1;
              pafVar10 = pafVar10 + 1;
              pafVar6 = pafVar6 + 1;
              local_108 = local_108 + 1;
            } while (lVar16 != 3);
            pafVar6 = flt_b;
            pafVar10 = flt_g;
            pafVar12 = flt_r;
            lVar16 = 0;
            do {
              lVar14 = 0;
              do {
                if ((fVar24 != 0.0) || (NAN(fVar24))) {
                  (*pafVar12)[lVar14] = (*pafVar12)[lVar14] / fVar24;
                }
                if ((fVar23 != 0.0) || (NAN(fVar23))) {
                  (*pafVar10)[lVar14] = (*pafVar10)[lVar14] / fVar23;
                }
                if ((fVar22 != 0.0) || (NAN(fVar22))) {
                  (*pafVar6)[lVar14] = (*pafVar6)[lVar14] / fVar22;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              lVar16 = lVar16 + 1;
              pafVar12 = pafVar12 + 1;
              pafVar10 = pafVar10 + 1;
              pafVar6 = pafVar6 + 1;
            } while (lVar16 != 3);
            fVar22 = 0.0;
            pafVar10 = flt_g;
            pafVar12 = flt_r;
            pafVar6 = flt_b;
            lVar16 = 0;
            fVar23 = 0.0;
            fVar24 = 0.0;
            do {
              lVar14 = 0;
              do {
                uVar7 = (*pcVar5)(src,iVar9 + (int)lVar14,iVar2 + (int)lVar16);
                uVar3 = (uint)uVar7;
                if (dst->trueColor == 0) {
                  fVar19 = (float)dst->red[(int)uVar3] * (*pafVar12)[lVar14];
                  fVar18 = (float)dst->green[(int)uVar3] * (*pafVar10)[lVar14];
                  uVar3 = dst->blue[(int)uVar3];
                }
                else {
                  fVar19 = (float)((uint)((ulong)uVar7 >> 0x10) & 0xff) * (*pafVar12)[lVar14];
                  fVar18 = (float)((uint)((ulong)uVar7 >> 8) & 0xff) * (*pafVar10)[lVar14];
                  uVar3 = uVar3 & 0xff;
                }
                fVar24 = fVar24 + fVar19;
                fVar23 = fVar23 + fVar18;
                fVar22 = fVar22 + (float)(int)uVar3 * (*pafVar6)[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              lVar16 = lVar16 + 1;
              pafVar6 = pafVar6 + 1;
              pafVar12 = pafVar12 + 1;
              pafVar10 = pafVar10 + 1;
            } while (lVar16 != 3);
            g = 0xff;
            iVar13 = 0xff;
            if (fVar24 <= 255.0) {
              fVar18 = 0.0;
              if (0.0 <= fVar24) {
                fVar18 = fVar24;
              }
              iVar13 = (int)fVar18;
            }
            if (fVar23 <= 255.0) {
              fVar24 = 0.0;
              if (0.0 <= fVar23) {
                fVar24 = fVar23;
              }
              g = (int)fVar24;
            }
            b = 0xff;
            if (fVar22 <= 255.0) {
              fVar23 = 0.0;
              if (0.0 <= fVar22) {
                fVar23 = fVar22;
              }
              b = (int)fVar23;
            }
            color = gdImageColorAllocateAlpha(src,iVar13,g,b,local_118);
            if (color == -1) {
              color = gdImageColorClosestAlpha(src,iVar13,g,b,local_118);
            }
            gdImageSetPixel(src,(int)uVar17,(int)uVar15,color);
            uVar17 = uVar17 + 1;
            uVar8 = (ulong)src->sx;
            iVar9 = iVar9 + 1;
          } while ((long)uVar17 < (long)uVar8);
          iVar9 = src->sy;
        }
        uVar15 = uVar15 + 1;
      } while ((long)uVar15 < (long)iVar9);
    }
    gdImageDestroy(dst);
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

BGD_DECLARE(int) gdImageSelectiveBlur( gdImagePtr src)
{
	int         x, y, i, j;
	float       new_r, new_g, new_b;
	int         new_pxl, cpxl, pxl, new_a=0;
	float flt_r [3][3];
	float flt_g [3][3];
	float flt_b [3][3];
	float flt_r_sum, flt_g_sum, flt_b_sum;

	gdImagePtr srcback;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	/* We need the orinal image with each safe neoghb. pixel */
	srcback = gdImageCreateTrueColor (src->sx, src->sy);
	if (srcback==NULL) {
		return 0;
	}
	gdImageCopy(srcback, src,0,0,0,0,src->sx,src->sy);

	f = GET_PIXEL_FUNCTION(src);

	for(y = 0; y<src->sy; y++) {
		for (x=0; x<src->sx; x++) {
		      flt_r_sum = flt_g_sum = flt_b_sum = 0.0;
			cpxl = f(src, x, y);

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					if ((j == 1) && (i == 1)) {
						flt_r[1][1] = flt_g[1][1] = flt_b[1][1] = 0.5;
					} else {
						pxl = f(src, x-(3>>1)+i, y-(3>>1)+j);
						new_a = gdImageAlpha(srcback, pxl);

						new_r = ((float)gdImageRed(srcback, cpxl)) - ((float)gdImageRed (srcback, pxl));

						if (new_r < 0.0f) {
							new_r = -new_r;
						}
						if (new_r != 0) {
							flt_r[j][i] = 1.0f/new_r;
						} else {
							flt_r[j][i] = 1.0f;
						}

						new_g = ((float)gdImageGreen(srcback, cpxl)) - ((float)gdImageGreen(srcback, pxl));

						if (new_g < 0.0f) {
							new_g = -new_g;
						}
						if (new_g != 0) {
							flt_g[j][i] = 1.0f/new_g;
						} else {
							flt_g[j][i] = 1.0f;
						}

						new_b = ((float)gdImageBlue(srcback, cpxl)) - ((float)gdImageBlue(srcback, pxl));

						if (new_b < 0.0f) {
							new_b = -new_b;
						}
						if (new_b != 0) {
							flt_b[j][i] = 1.0f/new_b;
						} else {
							flt_b[j][i] = 1.0f;
						}
					}

					flt_r_sum += flt_r[j][i];
					flt_g_sum += flt_g[j][i];
					flt_b_sum += flt_b [j][i];
				}
			}

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					if (flt_r_sum != 0.0) {
						flt_r[j][i] /= flt_r_sum;
					}
					if (flt_g_sum != 0.0) {
						flt_g[j][i] /= flt_g_sum;
					}
					if (flt_b_sum != 0.0) {
						flt_b [j][i] /= flt_b_sum;
					}
				}
			}

			new_r = new_g = new_b = 0.0;

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					pxl = f(src, x-(3>>1)+i, y-(3>>1)+j);
					new_r += (float)gdImageRed(srcback, pxl) * flt_r[j][i];
					new_g += (float)gdImageGreen(srcback, pxl) * flt_g[j][i];
					new_b += (float)gdImageBlue(srcback, pxl) * flt_b[j][i];
				}
			}

			new_r = (new_r > 255.0f)? 255.0f : ((new_r < 0.0f)? 0.0f:new_r);
			new_g = (new_g > 255.0f)? 255.0f : ((new_g < 0.0f)? 0.0f:new_g);
			new_b = (new_b > 255.0f)? 255.0f : ((new_b < 0.0f)? 0.0f:new_b);
			new_pxl = gdImageColorAllocateAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	gdImageDestroy(srcback);
	return 1;
}